

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AirPlatformAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::AirPlatformAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AirPlatformAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KINT32 Value_03;
  KINT32 Value_04;
  KINT32 Value_05;
  KINT32 Value_06;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  AirPlatformAppearance *local_18;
  AirPlatformAppearance *this_local;
  
  local_18 = this;
  this_local = (AirPlatformAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Air Platform Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tPaint Scheme:           ");
  ENUMS::GetEnumAsStringPaintScheme_abi_cxx11_(&local_1d0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tMobility Kill:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tNVG Mode:               ");
  ENUMS::GetEnumAsStringNVGMode_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((uint)*this >> 2 & 1),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tDamage:                 ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tSmoke:                  ");
  ENUMS::GetEnumAsStringEntitySmoke_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)((uint)*this >> 5 & 3),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"\n\tTrailing Effect:        ");
  ENUMS::GetEnumAsStringEntityTrailingEffect_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_03);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"\n\tCanopy State:           ");
  ENUMS::GetEnumAsStringEntityHatchState_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)((uint)*this >> 9 & 7),Value_04);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"\n\tLanding Lights:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xc & 1);
  poVar1 = std::operator<<(poVar1,"\n\tNavigation Lights:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xd & 1);
  poVar1 = std::operator<<(poVar1,"\n\tAnti-Collision Lights:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xe & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFlaming Effect:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xf & 1);
  poVar1 = std::operator<<(poVar1,"\n\tAfterburner:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x10 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tLower Anti-Collision Light: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x11 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tUpper Anti-Collision Light: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x12 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tAnti-Collision Light:   ");
  ENUMS::GetEnumAsStringAntiCollisionDayNight_abi_cxx11_
            (&local_290,(ENUMS *)(ulong)((uint)*this >> 0x13 & 1),Value_05);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,"\n\tIs Blinking:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x14 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tPower Plant:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x16 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFormation Lights:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x18 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tLanding Gear Extended:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x19 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tCargo Doors Opened:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1a & 1);
  poVar1 = std::operator<<(poVar1,"\n\tNavigation/Position Brightness: ");
  ENUMS::GetEnumAsStringNavigationPositionBrightness_abi_cxx11_
            (&local_2b0,(ENUMS *)(ulong)((uint)*this >> 0x1b & 1),Value_06);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  poVar1 = std::operator<<(poVar1,"\n\tSpot Lights:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1c & 1);
  poVar1 = std::operator<<(poVar1,"\n\tInterior Lights:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1d & 1);
  poVar1 = std::operator<<(poVar1,"\n\tReverse Thrust Engaged: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1e & 1);
  poVar1 = std::operator<<(poVar1,"\n\tWeight-on-Wheels:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1f);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString AirPlatformAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Air Platform Appearance:"
       << "\n\tPaint Scheme:           " << GetEnumAsStringPaintScheme( m_PaintScheme )
       << "\n\tMobility Kill:          " << m_MobilityKill
       << "\n\tNVG Mode:               " << GetEnumAsStringNVGMode( m_NVGMode )
       << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tSmoke:                  " << GetEnumAsStringEntitySmoke( m_Smoke )
       << "\n\tTrailing Effect:        " << GetEnumAsStringEntityTrailingEffect( m_TrailingEffect )
       << "\n\tCanopy State:           " << GetEnumAsStringEntityHatchState( m_CanopyState )
       << "\n\tLanding Lights:         " << m_LandingLights
       << "\n\tNavigation Lights:      " << m_NavLights
       << "\n\tAnti-Collision Lights:  " << m_AntiColLights
       << "\n\tFlaming Effect:         " << m_FlamingEffectField		
       << "\n\tAfterburner:            " << m_Afterburner
       << "\n\tLower Anti-Collision Light: " << m_LowerAntiCollisionLight
       << "\n\tUpper Anti-Collision Light: " << m_UpperAntiCollisionLight
       << "\n\tAnti-Collision Light:   " << GetEnumAsStringAntiCollisionDayNight( m_AntiCollisionLightDayNight )
       << "\n\tIs Blinking:            " << m_IsBlinking
       << "\n\tFrozen Status:          " << m_FrozenStatus
       << "\n\tPower Plant:            " << m_PowerPlantStatus
       << "\n\tState:                  " << m_State
       << "\n\tFormation Lights:       " << m_FormationLights
       << "\n\tLanding Gear Extended:  " << m_LandingGearExtended
       << "\n\tCargo Doors Opened:     " << m_CargoDoorsOpened
       << "\n\tNavigation/Position Brightness: " << GetEnumAsStringNavigationPositionBrightness( m_NavigationPositionBrightness )
       << "\n\tSpot Lights:            " << m_SpotLights
       << "\n\tInterior Lights:        " << m_InteriorLights
       << "\n\tReverse Thrust Engaged: " << m_ReverseThrustEngaged
       << "\n\tWeight-on-Wheels:       " << m_WeightOnWheels
       << "\n";

    return ss.str();
}